

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O2

QBitArray * __thiscall
QBitArray::inverted_inplace(QBitArray *__return_storage_ptr__,QBitArray *this)

{
  byte bVar1;
  byte *pbVar2;
  ulong capacity;
  Data *pDVar3;
  QTypedArrayData<char> *__old_val;
  ulong uVar4;
  int iVar5;
  longlong __old_val_1;
  char *__old_val_3;
  byte *pbVar6;
  long in_FS_OFFSET;
  pair<QTypedArrayData<char>_*,_char_*> pVar7;
  QArrayDataPointer<char> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar2 = (byte *)(this->d).d.ptr;
  capacity = (this->d).d.size;
  (__return_storage_ptr__->d).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  pDVar3 = (this->d).d.d;
  if (pDVar3 == (Data *)0x0) {
    if (capacity == 0) goto LAB_00318811;
  }
  else if ((capacity == 0) ||
          ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 1)) {
LAB_00318811:
    (this->d).d.d = (Data *)0x0;
    (this->d).d.ptr = (char *)0x0;
    (this->d).d.size = 0;
    pVar7.second = (char *)pbVar2;
    pVar7.first = pDVar3;
    goto LAB_0031881f;
  }
  pVar7 = QTypedArrayData<char>::allocate(capacity,KeepSize);
LAB_0031881f:
  pbVar6 = (byte *)pVar7.second;
  local_40.d = (Data *)0x0;
  local_40.ptr = (char *)0x0;
  (__return_storage_ptr__->d).d.d = pVar7.first;
  (__return_storage_ptr__->d).d.ptr = pVar7.second;
  local_40.size = 0;
  (__return_storage_ptr__->d).d.size = capacity;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
  if (capacity == 0) {
    iVar5 = 8;
  }
  else {
    bVar1 = *pbVar2;
    *pbVar6 = bVar1;
    iVar5 = 0x10 - (uint)bVar1;
  }
  for (uVar4 = 1; uVar4 < capacity; uVar4 = uVar4 + 1) {
    pbVar6[uVar4] = ~pbVar2[uVar4];
  }
  if (iVar5 != 8) {
    pbVar6[capacity - 1] = pbVar6[capacity - 1] & ~(byte)(-1 << ((byte)iVar5 & 0x1f));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE QBitArray QBitArray::inverted_inplace() &&
{
    qsizetype n = d.size();
    uchar *dst = reinterpret_cast<uchar *>(data_ptr().data());
    const uchar *src = dst;
    QBitArray result([&] {
        if (d.isDetached() || n == 0)
            return std::move(d.data_ptr());     // invert in-place

        QByteArrayData tmp(n, n);
        dst = reinterpret_cast<uchar *>(tmp.data());
        return tmp;
    }());

    uchar bitdiff = 8;
    if (n)
        bitdiff = dst[0] = src[0];      // copy the count of bits in the last byte

    for (qsizetype i = 1; i < n; ++i)
        dst[i] = ~src[i];

    if (int tailCount = 16 - bitdiff; tailCount != 8) {
        // zero the bits beyond our size in the last byte
        Q_ASSERT(n > 1);
        uchar tailMask = (1U << tailCount) - 1;
        dst[n - 1] &= tailMask;
    }

    return result;
}